

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall Qentem::String<char>::Write(String<char> *this,char *str,SizeT len)

{
  SizeT size_00;
  uint new_length;
  char *from;
  char *to;
  char *ns;
  char *src;
  SizeT new_len;
  SizeT src_len;
  SizeT32 size;
  SizeT len_local;
  char *str_local;
  String<char> *this_local;
  
  if ((str != (char *)0x0) && (len != 0)) {
    size_00 = Length(this);
    new_length = size_00 + len;
    from = Storage(this);
    to = allocate(this,new_length + 1);
    Memory::Copy<unsigned_int>(to + size_00,str,len);
    to[new_length] = '\0';
    setLength(this,new_length);
    if (from != (char *)0x0) {
      Memory::Copy<unsigned_int>(to,from,size_00);
      Memory::Deallocate(from);
    }
  }
  return;
}

Assistant:

void Write(const Char_T *str, const SizeT len) {
        if ((str != nullptr) && (len != 0)) {
            constexpr SizeT32 size    = sizeof(Char_T);
            const SizeT       src_len = Length();
            SizeT             new_len = (src_len + len + SizeT{1});
            Char_T           *src     = Storage();
            Char_T           *ns      = allocate(new_len);

            Memory::Copy((ns + src_len), str, (len * size));
            --new_len;
            ns[new_len] = Char_T{0};
            setLength(new_len);

            if (src != nullptr) {
                Memory::Copy(ns, src, (src_len * size));
                Memory::Deallocate(src);
            }
        }
    }